

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

void drain_stream(Curl_cfilter *cf,Curl_easy *data,stream_ctx *stream)

{
  byte bVar1;
  
  bVar1 = 1;
  if ((stream->send_closed == false) &&
     ((stream->upload_left != 0 || (stream->upload_blocked_len != 0)))) {
    bVar1 = 3;
  }
  if ((data->state).select_bits == bVar1) {
    return;
  }
  if (((cf != (Curl_cfilter *)0x0) && ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) &&
     (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(data,cf,"[%d] DRAIN select_bits=%x",(ulong)(uint)stream->id,(ulong)bVar1);
  }
  (data->state).select_bits = bVar1;
  Curl_expire(data,0,EXPIRE_RUN_NOW);
  return;
}

Assistant:

static void drain_stream(struct Curl_cfilter *cf,
                         struct Curl_easy *data,
                         struct stream_ctx *stream)
{
  unsigned char bits;

  (void)cf;
  bits = CURL_CSELECT_IN;
  if(!stream->send_closed &&
     (stream->upload_left || stream->upload_blocked_len))
    bits |= CURL_CSELECT_OUT;
  if(data->state.select_bits != bits) {
    CURL_TRC_CF(data, cf, "[%d] DRAIN select_bits=%x",
                stream->id, bits);
    data->state.select_bits = bits;
    Curl_expire(data, 0, EXPIRE_RUN_NOW);
  }
}